

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

VkDescriptorSet __thiscall
Diligent::DynamicDescriptorSetAllocator::Allocate
          (DynamicDescriptorSetAllocator *this,VkDescriptorSetLayout SetLayout,char *DebugName)

{
  VulkanLogicalDevice *LogicalDevice;
  pointer pVVar1;
  VkDescriptorSet pVVar2;
  DescriptorPoolManager *this_00;
  DescriptorPoolWrapper DStack_48;
  
  this_00 = this->m_GlobalPoolMgr;
  LogicalDevice =
       (this_00->m_DeviceVkImpl->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVVar1 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_AllocatedPools).
      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pVVar1) {
    pVVar2 = AllocateDescriptorSet(LogicalDevice,pVVar1[-1].m_VkObject,SetLayout,DebugName);
    if (pVVar2 != (VkDescriptorSet)0x0) {
      return pVVar2;
    }
    this_00 = this->m_GlobalPoolMgr;
  }
  DescriptorPoolManager::GetPool(&DStack_48,this_00,"Dynamic Descriptor Pool");
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
  ::
  emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
            ((vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
              *)&this->m_AllocatedPools,&DStack_48);
  VulkanUtilities::
  VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
  ~VulkanObjectWrapper(&DStack_48);
  pVVar2 = AllocateDescriptorSet
                     (LogicalDevice,
                      (this->m_AllocatedPools).
                      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].m_VkObject,SetLayout,DebugName)
  ;
  return pVVar2;
}

Assistant:

VkDescriptorSet DynamicDescriptorSetAllocator::Allocate(VkDescriptorSetLayout SetLayout, const char* DebugName)
{
    VkDescriptorSet                             set           = VK_NULL_HANDLE;
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_GlobalPoolMgr.GetDeviceVkImpl().GetLogicalDevice();
    if (!m_AllocatedPools.empty())
    {
        set = AllocateDescriptorSet(LogicalDevice, m_AllocatedPools.back(), SetLayout, DebugName);
    }

    if (set == VK_NULL_HANDLE)
    {
        m_AllocatedPools.emplace_back(m_GlobalPoolMgr.GetPool("Dynamic Descriptor Pool"));
        set = AllocateDescriptorSet(LogicalDevice, m_AllocatedPools.back(), SetLayout, DebugName);
    }

    return set;
}